

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O2

void __thiscall Js::ConfigFlagsTable::FlagSetCallback_ES6All(ConfigFlagsTable *this,Boolean value)

{
  Flag flag;
  ulong uVar1;
  undefined7 in_register_00000031;
  ConfigFlagsTable *this_00;
  
  uVar1 = CONCAT71(in_register_00000031,value) & 0xffffffff;
  this_00 = this;
  flag = GetNextChildFlag(this,ES6Flag,InvalidFlag);
  do {
    if (flag != ES6VerboseFlag) {
      if (flag == InvalidFlag) {
        return;
      }
      Output::VerboseNote(L"FLAG %s = %d - setting child flag %s = %d\n",L"ES6",uVar1,
                          (&FlagNames)[flag],CONCAT71(in_register_00000031,value) & 0xffffffff);
      this_00 = this;
      SetAsBoolean(this,flag,SUB81(uVar1,0));
    }
    flag = GetNextChildFlag(this_00,ES6Flag,flag);
  } while( true );
}

Assistant:

void
    ConfigFlagsTable::FlagSetCallback_ES6All(Boolean value)
    {
        // iterate through all ES6 flags - and set them explicitly (except ES6Verbose)
        Flag parentFlag = ES6Flag;

        // parent ES6 flag, will iterate through all child ES6 flags
        Flag childFlag = GetNextChildFlag(parentFlag, /* no currentChildFlag */ InvalidFlag);
        while (childFlag != InvalidFlag)
        {
            // skip verbose
            if (childFlag != ES6VerboseFlag)
            {
                Boolean childValue = value;

                Output::VerboseNote(_u("FLAG %s = %d - setting child flag %s = %d\n"), FlagNames[(int) parentFlag], value, FlagNames[(int) childFlag], childValue);
                this->SetAsBoolean(childFlag, childValue);
            }

            // get next child flag
            childFlag = GetNextChildFlag(parentFlag, /* currentChildFlag */ childFlag);
        }
    }